

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.h
# Opt level: O1

vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> * __thiscall
phmap::priv::GenerateValuesWithSeed<std::pair<long,long>>
          (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
           *__return_storage_ptr__,priv *this,size_t n,int maxval,int seed)

{
  pointer *pppVar1;
  iterator __position;
  int maxval_00;
  priv *ppVar2;
  Generator<std::pair<long,_long>_> gen;
  vector<int,_std::allocator<int>_> nums;
  Generator<std::pair<long,_long>_> local_60;
  pair<long,_long> local_58;
  vector<int,_std::allocator<int>_> local_48;
  
  maxval_00 = (int)n;
  GenerateNumbersWithSeed(&local_48,(size_t)this,maxval_00,maxval);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.tgen.maxval = maxval_00;
  local_60.ugen.maxval = maxval_00;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::reserve
            (__return_storage_ptr__,(size_type)this);
  if (this != (priv *)0x0) {
    ppVar2 = (priv *)0x0;
    do {
      local_58 = Generator<std::pair<long,_long>_>::operator()
                           (&local_60,
                            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)ppVar2]);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
        _M_realloc_insert<std::pair<long,long>>
                  ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
                   __return_storage_ptr__,__position,&local_58);
      }
      else {
        (__position._M_current)->first = local_58.first;
        (__position._M_current)->second = local_58.second;
        pppVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      ppVar2 = ppVar2 + 1;
    } while (this != ppVar2);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<V> GenerateValuesWithSeed(size_t n, int maxval, int seed) {
        const std::vector<int> nums = GenerateNumbersWithSeed(n, maxval, seed);
        Generator<V> gen(maxval);
        std::vector<V> vec;

        vec.reserve(n);
        for (size_t i = 0; i < n; i++) {
            vec.push_back(gen(nums[i]));
        }

        return vec;
    }